

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitAtomicWait(I64ToI32Lowering *this,AtomicWait *curr)

{
  Builder *this_00;
  Builder *this_01;
  char *pcVar1;
  Index index;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  TempVar local_a0;
  Const *local_80;
  Expression *local_78;
  Expression *pEStack_70;
  Expression *local_68;
  LocalGet *local_60;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  size_t local_40;
  allocator_type local_31;
  
  pcVar1 = DAT_01174f88;
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_40 = ABI::wasm2js::ATOMIC_WAIT_I32;
  local_80 = Builder::makeConst<int>(this_00,(int)(curr->offset).addr);
  local_78 = curr->ptr;
  pEStack_70 = curr->expected;
  local_68 = curr->timeout;
  this_01 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  fetchOutParam(&local_a0,this,local_68);
  index = TempVar::operator_cast_to_unsigned_int(&local_a0);
  local_60 = Builder::makeLocalGet(this_01,index,(Type)0x2);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_80;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_58,__l,
             &local_31);
  target.super_IString.str._M_str = pcVar1;
  target.super_IString.str._M_len = local_40;
  expression = Builder::makeCall(this_00,target,
                                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                 &local_58,(Type)0x2,false);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_58);
  TempVar::~TempVar(&local_a0);
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    // The last parameter is an i64, so we cannot leave it as it is
    replaceCurrent(builder->makeCall(
      ABI::wasm2js::ATOMIC_WAIT_I32,
      {builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->expected,
       curr->timeout,
       builder->makeLocalGet(fetchOutParam(curr->timeout), Type::i32)},
      Type::i32));
  }